

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O2

Gia_Man_t * Abc_EnumeratePaths(int nSize)

{
  int iVar1;
  int iVar2;
  int iLit1;
  Gia_Man_t *p;
  int *__ptr;
  Gia_Man_t *pGVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  
  p = Gia_ManStart(10000);
  uVar8 = nSize + 1;
  __ptr = (int *)calloc((long)(int)uVar8,4);
  iVar1 = nSize * uVar8 * 2;
  iVar4 = 0;
  if (0 < iVar1) {
    iVar4 = iVar1;
  }
  while (bVar9 = iVar4 != 0, iVar4 = iVar4 + -1, bVar9) {
    Gia_ManAppendCi(p);
  }
  Gia_ManHashAlloc(p);
  uVar7 = 0;
  if (0 < nSize) {
    uVar7 = (ulong)(uint)nSize;
  }
  *__ptr = 1;
  for (lVar5 = 1; lVar5 - uVar7 != 1; lVar5 = lVar5 + 1) {
    iVar1 = __ptr[lVar5 + -1];
    iVar4 = Abc_Var2Lit((int)lVar5,0);
    iVar1 = Gia_ManHashAnd(p,iVar1,iVar4);
    __ptr[lVar5] = iVar1;
  }
  for (iVar1 = 1; iVar1 != (int)uVar7 + 1; iVar1 = iVar1 + 1) {
    iVar4 = *__ptr;
    iVar2 = Abc_NodeVarY(nSize,iVar1,0);
    iVar4 = Gia_ManHashAnd(p,iVar4,iVar2);
    *__ptr = iVar4;
    for (uVar6 = 1; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      iVar4 = __ptr[uVar6 - 1];
      iVar2 = Abc_NodeVarX(nSize,iVar1,(int)uVar6);
      iVar2 = Gia_ManHashAnd(p,iVar4,iVar2);
      iVar4 = __ptr[uVar6];
      iLit1 = Abc_NodeVarY(nSize,iVar1,(int)uVar6);
      iVar4 = Gia_ManHashAnd(p,iVar4,iLit1);
      iVar4 = Gia_ManHashOr(p,iVar2,iVar4);
      __ptr[uVar6] = iVar4;
    }
  }
  Gia_ManAppendCo(p,__ptr[nSize]);
  pGVar3 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  free(__ptr);
  return pGVar3;
}

Assistant:

Gia_Man_t * Abc_EnumeratePaths( int nSize )
{
    Gia_Man_t * pTemp, * pGia = Gia_ManStart( 10000 );
    int * pNodes = ABC_CALLOC( int, nSize+1 );
    int x, y, nVars = 2*nSize*(nSize+1);
    for ( x = 0; x < nVars; x++ )
        Gia_ManAppendCi( pGia );
    Gia_ManHashAlloc( pGia );
    // y = 0; x = 0;
    pNodes[0] = 1;
    // y = 0; x > 0 
    for ( x = 1; x <= nSize; x++ )
        pNodes[x] = Gia_ManHashAnd( pGia, pNodes[x-1], Abc_NodeVarX(nSize, 0, x) );
    // y > 0; x >= 0
    for ( y = 1; y <= nSize; y++ )
    {
        // y > 0; x = 0
        pNodes[0] = Gia_ManHashAnd( pGia, pNodes[0], Abc_NodeVarY(nSize, y, 0) );
        // y > 0; x > 0
        for ( x = 1; x <= nSize; x++ )
        {
            int iHor  = Gia_ManHashAnd( pGia, pNodes[x-1], Abc_NodeVarX(nSize, y, x) );
            int iVer  = Gia_ManHashAnd( pGia, pNodes[x],   Abc_NodeVarY(nSize, y, x) );
            pNodes[x] = Gia_ManHashOr( pGia, iHor, iVer );
        }
    }
    Gia_ManAppendCo( pGia, pNodes[nSize] );
    pGia = Gia_ManCleanup( pTemp = pGia );
    Gia_ManStop( pTemp );
    ABC_FREE( pNodes );
    return pGia;
}